

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::gatherArray2DOffsetsCompare
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float ref,float s,float t,
          int depth,IVec2 (*offsets) [4])

{
  CompareMode compare;
  bool isFixedPoint;
  int i;
  long lVar1;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar5;
  Vec4 gathered;
  tcu local_40 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&src->m_format);
  VVar5 = fetchGatherArray2DOffsets(local_40,src,sampler,s,t,depth,0,offsets);
  uVar4 = VVar5.m_data._8_8_;
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  compare = sampler->compare;
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = execCompare((Vec4 *)local_40,compare,(int)lVar1,ref,isFixedPoint);
    uVar3 = CONCAT44(extraout_XMM0_Db,fVar2);
    *(float *)(this + lVar1 * 4) = fVar2;
  }
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)((ulong)uVar3 >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 gatherArray2DOffsetsCompare (const ConstPixelBufferAccess& src, const Sampler& sampler, float ref, float s, float t, int depth, const IVec2 (&offsets)[4])
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(src.getFormat().order == TextureFormat::D || src.getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	const bool	isFixedPoint	= isFixedPointDepthTextureFormat(src.getFormat());
	const Vec4	gathered		= fetchGatherArray2DOffsets(src, sampler, s, t, depth, 0 /* component 0: depth */, offsets);
	Vec4		result;

	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}